

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

bool __thiscall
caffe::SPPParameter::MergePartialFromCodedStream(SPPParameter *this,CodedInputStream *input)

{
  InternalMetadataWithArena *this_00;
  byte bVar1;
  byte *pbVar2;
  void *pvVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  undefined8 in_RAX;
  int64 iVar7;
  int number;
  UnknownFieldSet *pUVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 local_38;
  
  this_00 = &this->_internal_metadata_;
  local_38 = in_RAX;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b2aa2;
      input->buffer_ = pbVar2 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b2aa2:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar11 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar5 | uVar11;
    }
    uVar10 = (uint)uVar11;
    number = 6;
    if ((uVar11 & 0x100000000) == 0) {
LAB_003b2ac4:
      if ((uVar10 & 7) == 4 || uVar10 == 0) {
        number = 7;
      }
      else {
        pvVar3 = (this_00->
                 super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ).ptr_;
        if (((ulong)pvVar3 & 1) == 0) {
          pUVar8 = google::protobuf::internal::
                   InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   ::mutable_unknown_fields_slow
                             (&this_00->
                               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                             );
        }
        else {
          pUVar8 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
        }
        bVar4 = google::protobuf::internal::WireFormat::SkipField(input,uVar10,pUVar8);
        number = 6;
        if (bVar4) goto LAB_003b2b45;
      }
    }
    else {
      uVar6 = (uint)(uVar11 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar11;
      if (uVar6 == 6) {
        if (cVar9 != '0') goto LAB_003b2ac4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar11 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b2bfd;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_003b2bfd:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar11;
        }
        if (bVar4) {
          local_38._0_4_ = (uint)uVar11;
        }
        if (bVar4) {
          if (2 < (uint)local_38) {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            uVar10 = (uint)local_38;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar8 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar8 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            goto LAB_003b2c42;
          }
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
          this->engine_ = (uint)local_38;
          goto LAB_003b2c47;
        }
      }
      else {
        if (uVar6 != 2) {
          if ((uVar6 != 1) || (cVar9 != '\b')) goto LAB_003b2ac4;
          *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
          pbVar2 = input->buffer_;
          if (pbVar2 < input->buffer_end_) {
            bVar1 = *pbVar2;
            uVar5 = (uint32)bVar1;
            if (-1 < (char)bVar1) {
              this->pyramid_height_ = (uint)bVar1;
              input->buffer_ = pbVar2 + 1;
              goto LAB_003b2b45;
            }
          }
          else {
            uVar5 = 0;
          }
          iVar7 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          this->pyramid_height_ = (uint32)iVar7;
          if (-1 < iVar7) goto LAB_003b2b45;
          goto LAB_003b2b47;
        }
        if (cVar9 != '\x10') goto LAB_003b2ac4;
        pbVar2 = input->buffer_;
        if (pbVar2 < input->buffer_end_) {
          bVar1 = *pbVar2;
          uVar11 = (ulong)bVar1;
          uVar5 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_003b2bad;
          input->buffer_ = pbVar2 + 1;
          bVar4 = true;
        }
        else {
          uVar5 = 0;
LAB_003b2bad:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar5);
          bVar4 = -1 < (long)uVar11;
        }
        if (bVar4) {
          local_38._4_4_ = (uint)uVar11;
        }
        if (bVar4) {
          if (local_38._4_4_ < 3) {
            *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
            this->pool_ = local_38._4_4_;
          }
          else {
            pvVar3 = (this_00->
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                     ).ptr_;
            if (((ulong)pvVar3 & 1) == 0) {
              pUVar8 = google::protobuf::internal::
                       InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       ::mutable_unknown_fields_slow
                                 (&this_00->
                                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                                 );
            }
            else {
              pUVar8 = (UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe);
            }
            number = 2;
            uVar10 = local_38._4_4_;
LAB_003b2c42:
            google::protobuf::UnknownFieldSet::AddVarint(pUVar8,number,(long)(int)uVar10);
          }
LAB_003b2c47:
          number = 0;
        }
      }
      if (bVar4) {
LAB_003b2b45:
        number = 0;
      }
    }
LAB_003b2b47:
    if (number != 0) {
      return number != 6;
    }
  } while( true );
}

Assistant:

bool SPPParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.SPPParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional uint32 pyramid_height = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          set_has_pyramid_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &pyramid_height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter.PoolMethod pool = 2 [default = MAX];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SPPParameter_PoolMethod_IsValid(value)) {
            set_pool(static_cast< ::caffe::SPPParameter_PoolMethod >(value));
          } else {
            mutable_unknown_fields()->AddVarint(2, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional .caffe.SPPParameter.Engine engine = 6 [default = DEFAULT];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          if (::caffe::SPPParameter_Engine_IsValid(value)) {
            set_engine(static_cast< ::caffe::SPPParameter_Engine >(value));
          } else {
            mutable_unknown_fields()->AddVarint(6, value);
          }
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.SPPParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.SPPParameter)
  return false;
#undef DO_
}